

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1533.c
# Opt level: O0

int perform_and_check_connections(CURL *curl,char *description,long expected_connections)

{
  long local_38;
  long connections;
  long lStack_28;
  CURLcode res;
  long expected_connections_local;
  char *description_local;
  CURL *curl_local;
  
  local_38 = 0;
  lStack_28 = expected_connections;
  expected_connections_local = (long)description;
  description_local = (char *)curl;
  connections._4_4_ = curl_easy_perform(curl);
  if (connections._4_4_ == 0) {
    connections._4_4_ = curl_easy_getinfo(description_local,0x20001a,&local_38);
    if (connections._4_4_ == 0) {
      curl_mfprintf(_stderr,"%s: expected: %ld connections; actual: %ld connections\n",
                    expected_connections_local,lStack_28,local_38);
      if (local_38 == lStack_28) {
        curl_local._4_4_ = 0x78;
      }
      else {
        curl_local._4_4_ = 0x77;
      }
    }
    else {
      curl_mfprintf(_stderr,"curl_easy_getinfo() failed\n");
      curl_local._4_4_ = 0x7e;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_easy_perform() failed\n");
    curl_local._4_4_ = 0x7e;
  }
  return curl_local._4_4_;
}

Assistant:

static int perform_and_check_connections(CURL *curl, const char *description,
                                         long expected_connections)
{
  CURLcode res;
  long connections = 0;

  res = curl_easy_perform(curl);
  if(res != CURLE_OK) {
    fprintf(stderr, "curl_easy_perform() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res = curl_easy_getinfo(curl, CURLINFO_NUM_CONNECTS, &connections);
  if(res != CURLE_OK) {
    fprintf(stderr, "curl_easy_getinfo() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  fprintf(stderr, "%s: expected: %ld connections; actual: %ld connections\n",
          description, expected_connections, connections);

  if(connections != expected_connections) {
    return TEST_ERR_FAILURE;
  }

  return TEST_ERR_SUCCESS;
}